

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

void jsoncons::detail::prettify_string<std::__cxx11::string>
               (char *buffer,size_t length,int k,int min_exp,int max_exp,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  int i;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int i_1;
  
  iVar1 = (int)length;
  uVar2 = iVar1 + k;
  cVar3 = (char)result;
  if ((int)uVar2 <= max_exp && -1 < k) {
    uVar5 = 0;
    uVar7 = 0;
    if (0 < iVar1) {
      uVar7 = length & 0xffffffff;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
    for (; (int)length < (int)uVar2; length = (size_t)((int)length + 1)) {
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    return;
  }
  if ((int)uVar2 < 1 || max_exp < (int)uVar2) {
    if ((int)uVar2 <= min_exp || 0 < (int)uVar2) {
      std::__cxx11::string::push_back(cVar3);
      if (iVar1 != 1) {
        std::__cxx11::string::push_back(cVar3);
        for (lVar6 = 1; lVar6 < iVar1; lVar6 = lVar6 + 1) {
          std::__cxx11::string::push_back(cVar3);
        }
      }
      std::__cxx11::string::push_back(cVar3);
      fill_exponent<std::__cxx11::string>(uVar2 - 1,result);
      return;
    }
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    for (iVar4 = 2; iVar4 < (int)(2 - uVar2); iVar4 = iVar4 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
    uVar5 = 0;
    uVar7 = 0;
    if (0 < iVar1) {
      uVar7 = length & 0xffffffff;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
  }
  else {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
    std::__cxx11::string::push_back(cVar3);
    for (; (int)uVar2 < iVar1; uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back(cVar3);
    }
  }
  return;
}

Assistant:

void prettify_string(const char *buffer, std::size_t length, int k, int min_exp, int max_exp, Result& result)
    {
        int nb_digits = (int)length;
        int offset;
        /* v = buffer * 10^k
           kk is such that 10^(kk-1) <= v < 10^kk
           this way kk gives the position of the decimal point.
        */
        int kk = nb_digits + k;

        if (nb_digits <= kk && kk <= max_exp)
        {
            /* the first digits are already in. Add some 0s and call it a day. */
            /* the max_exp is a personal choice. Only 16 digits could possibly be relevant.
             * Basically we want to print 12340000000 rather than 1234.0e7 or 1.234e10 */
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            for (int i = nb_digits; i < kk; ++i)
            {
                result.push_back('0');
            }
            result.push_back('.');
            result.push_back('0');
        } 
        else if (0 < kk && kk <= max_exp)
        {
            /* comma number. Just insert a '.' at the correct location. */
            for (int i = 0; i < kk; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('.');
            for (int i = kk; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (min_exp < kk && kk <= 0)
        {
            offset = 2 - kk;

            result.push_back('0');
            result.push_back('.');
            for (int i = 2; i < offset; ++i) 
                result.push_back('0');
            for (int i = 0; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
        } 
        else if (nb_digits == 1)
        {
            result.push_back(buffer[0]);
            result.push_back('e');
            fill_exponent(kk - 1, result);
        } 
        else
        {
            result.push_back(buffer[0]);
            result.push_back('.');
            for (int i = 1; i < nb_digits; ++i)
            {
                result.push_back(buffer[i]);
            }
            result.push_back('e');
            fill_exponent(kk - 1, result);
        }
    }